

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O1

int secp256k1_scratch_allocate_frame(secp256k1_scratch *scratch,size_t n,size_t objects)

{
  secp256k1_callback *psVar1;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  size_t __size;
  
  lVar2 = 0;
  if (scratch->frame != 0) {
    sVar6 = 0;
    do {
      lVar2 = lVar2 + scratch->frame_size[sVar6];
      sVar6 = sVar6 + 1;
    } while (scratch->frame != sVar6);
  }
  uVar5 = scratch->max_size - lVar2;
  uVar3 = 0;
  if (objects * 0x10 <= uVar5) {
    uVar3 = uVar5 + objects * -0x10;
  }
  iVar7 = 0;
  if (n <= uVar3) {
    __size = objects * 0x10 + n;
    psVar1 = scratch->error_callback;
    pvVar4 = malloc(__size);
    if (pvVar4 == (void *)0x0) {
      (*psVar1->fn)("Out of memory",psVar1->data);
    }
    sVar6 = scratch->frame;
    scratch->data[sVar6] = pvVar4;
    iVar7 = 0;
    if (pvVar4 != (void *)0x0) {
      scratch->frame_size[sVar6] = __size;
      scratch->offset[scratch->frame] = 0;
      scratch->frame = scratch->frame + 1;
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

static int secp256k1_scratch_allocate_frame(secp256k1_scratch* scratch, size_t n, size_t objects) {
    VERIFY_CHECK(scratch->frame < SECP256K1_SCRATCH_MAX_FRAMES);

    if (n <= secp256k1_scratch_max_allocation(scratch, objects)) {
        n += objects * ALIGNMENT;
        scratch->data[scratch->frame] = checked_malloc(scratch->error_callback, n);
        if (scratch->data[scratch->frame] == NULL) {
            return 0;
        }
        scratch->frame_size[scratch->frame] = n;
        scratch->offset[scratch->frame] = 0;
        scratch->frame++;
        return 1;
    } else {
        return 0;
    }
}